

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

int cs_impl::number_cs_ext::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  element_type *peVar2;
  name_space *name;
  __shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffef0;
  allocator *var;
  string *in_stack_fffffffffffffef8;
  name_space *in_stack_ffffffffffffff00;
  name_space *this;
  undefined1 request_fold;
  allocator *func;
  allocator local_c1;
  string local_c0 [47];
  undefined1 local_91 [48];
  allocator local_61;
  string local_60 [63];
  allocator local_21;
  string local_20 [32];
  
  peVar2 = std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(in_stack_fffffffffffffef0);
  request_fold = (undefined1)((ulong)peVar2 >> 0x38);
  func = &local_21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"is_integer",func);
  cs::make_cni<bool(&)(cs::numeric_const&)>((_func_bool_numeric_ptr *)func,(bool)request_fold);
  cs::name_space::add_var
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(var *)in_stack_fffffffffffffef0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"is_float",&local_61);
  cs::make_cni<bool(&)(cs::numeric_const&)>((_func_bool_numeric_ptr *)func,(bool)request_fold);
  cs::name_space::add_var
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(var *)in_stack_fffffffffffffef0);
  this = (name_space *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_91 + 1),"ntoi",(allocator *)this);
  cs::make_cni<cs::numeric&(&)(cs::numeric&)>
            ((_func_numeric_ptr_numeric_ptr *)func,(bool)request_fold);
  name = cs::name_space::add_var(this,in_stack_fffffffffffffef8,(var *)in_stack_fffffffffffffef0);
  var = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"ntof",var);
  cs::make_cni<cs::numeric&(&)(cs::numeric&)>
            ((_func_numeric_ptr_numeric_ptr *)func,(bool)request_fold);
  cs::name_space::add_var(this,(string *)name,(var *)var);
  any::~any((any *)0x42ebe0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  any::~any((any *)0x42ebfe);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  any::~any((any *)0x42ec25);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  any::~any((any *)0x42ec4c);
  std::__cxx11::string::~string(local_20);
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return iVar1;
}

Assistant:

void init()
		{
			(*number_ext)
			.add_var("is_integer", make_cni(is_integer))
			.add_var("is_float", make_cni(is_float))
			.add_var("ntoi", make_cni(ntoi))
			.add_var("ntof", make_cni(ntof));
		}